

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O2

Aig_Man_t * Saig_ManCreateIndMiter(Aig_Man_t *pAig,Vec_Vec_t *vCands)

{
  int iVar1;
  size_t __nmemb;
  Aig_Obj_t **pObjMap;
  Aig_Man_t *p;
  char *pcVar2;
  long lVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  Vec_Ptr_t *p_00;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int local_4c;
  
  __nmemb = (long)pAig->vObjs->nSize * 2;
  pObjMap = (Aig_Obj_t **)calloc(__nmemb,8);
  p = Aig_ManStart((int)__nmemb);
  pcVar2 = Abc_UtilStrsav(pAig->pName);
  p->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(pAig->pSpec);
  p->pSpec = pcVar2;
  pAVar5 = p->pConst1;
  lVar3 = (long)pAig->pConst1->Id;
  pObjMap[lVar3 * 2] = pAVar5;
  pObjMap[lVar3 * 2 + 1] = pAVar5;
  for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
    for (iVar8 = 0; iVar8 < pAig->nObjs[2] - pAig->nRegs; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,iVar8);
      pAVar5 = Aig_ObjCreateCi(p);
      pObjMap[(long)iVar9 + (long)*(int *)((long)pvVar4 + 0x24) * 2] = pAVar5;
    }
  }
  for (iVar9 = pAig->nObjs[2] - pAig->nRegs; iVar9 < pAig->vCis->nSize; iVar9 = iVar9 + 1) {
    pvVar4 = Vec_PtrEntry(pAig->vCis,iVar9);
    pAVar5 = Aig_ObjCreateCi(p);
    pObjMap[(long)*(int *)((long)pvVar4 + 0x24) * 2] = pAVar5;
  }
  for (local_4c = 0; local_4c != 2; local_4c = local_4c + 1) {
    for (iVar9 = 0; iVar9 < pAig->vObjs->nSize; iVar9 = iVar9 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar9);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        pAVar6 = Aig_ObjChild0Frames(pObjMap,2,pAVar5,local_4c);
        p1 = Aig_ObjChild1Frames(pObjMap,2,pAVar5,local_4c);
        pAVar6 = Aig_And(p,pAVar6,p1);
        pObjMap[(long)local_4c + (long)pAVar5->Id * 2] = pAVar6;
      }
    }
    for (iVar9 = 0; iVar9 < pAig->nRegs; iVar9 = iVar9 + 1) {
      pAVar5 = Aig_ManLi(pAig,iVar9);
      pAVar6 = Aig_ManLo(pAig,iVar9);
      if (local_4c == 0) {
        pAVar5 = Aig_ObjChild0Frames(pObjMap,2,pAVar5,0);
        pObjMap[(long)pAVar6->Id * 2 + 1] = pAVar5;
      }
    }
  }
  for (iVar9 = 0; iVar9 < vCands->nSize; iVar9 = iVar9 + 1) {
    p_00 = Vec_VecEntry(vCands,iVar9);
    for (iVar8 = 0; iVar8 < p_00->nSize; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(p_00,iVar8);
      iVar1 = *(int *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x24);
      uVar7 = (ulong)((uint)pvVar4 & 1);
      pAVar5 = Aig_And(p,(Aig_Obj_t *)((ulong)pObjMap[(long)iVar1 * 2] ^ uVar7),
                       (Aig_Obj_t *)(uVar7 ^ (ulong)pObjMap[iVar1 * 2 + 1] ^ 1));
      Aig_ObjCreateCo(p,pAVar5);
    }
  }
  Aig_ManCleanup(p);
  free(pObjMap);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManCreateIndMiter( Aig_Man_t * pAig, Vec_Vec_t * vCands )
{
    int nFrames = 2;
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f, k;

    // create mapping for the frames nodes
    pObjMap  = ABC_CALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Aig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Aig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );

    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Aig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Aig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }

    // go through the candidates
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            Aig_Obj_t * pObjR  = Aig_Regular(pObj);
            Aig_Obj_t * pNode0 = pObjMap[nFrames*Aig_ObjId(pObjR)+0];
            Aig_Obj_t * pNode1 = pObjMap[nFrames*Aig_ObjId(pObjR)+1];
            Aig_Obj_t * pFan0  = Aig_NotCond( pNode0,  Aig_IsComplement(pObj) );
            Aig_Obj_t * pFan1  = Aig_NotCond( pNode1, !Aig_IsComplement(pObj) );
            Aig_Obj_t * pMiter = Aig_And( pFrames, pFan0, pFan1 );
            Aig_ObjCreateCo( pFrames, pMiter );
        }
    }
    Aig_ManCleanup( pFrames );
    ABC_FREE( pObjMap );

//Aig_ManShow( pAig, 0, NULL );
//Aig_ManShow( pFrames, 0, NULL );
    return pFrames;
}